

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_append_entries.cxx
# Opt level: O0

bool __thiscall
nuraft::raft_server::try_update_precommit_index(raft_server *this,ulong desired,size_t MAX_ATTEMPTS)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  __int_type _Var5;
  element_type *peVar6;
  ulong *puVar7;
  ulong in_RDX;
  ulong in_RSI;
  long in_RDI;
  ulong prev_precommit_index;
  size_t num_attempts;
  undefined8 in_stack_fffffffffffffe10;
  string *format;
  undefined7 in_stack_fffffffffffffe18;
  undefined1 in_stack_fffffffffffffe1f;
  bool local_b2;
  string local_98 [32];
  ulong local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  undefined4 local_4c;
  ulong local_48;
  ulong *local_40;
  ulong *local_38;
  bool local_29;
  ulong local_28;
  memory_order local_20;
  undefined4 local_1c;
  ulong local_18;
  ulong *local_10;
  ulong *local_8;
  
  local_70 = 0;
  local_68 = in_RDX;
  local_60 = in_RSI;
  local_78 = std::__atomic_base::operator_cast_to_unsigned_long
                       ((__atomic_base<unsigned_long> *)
                        CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
  while( true ) {
    uVar1 = local_60;
    local_b2 = false;
    if (local_78 < local_60) {
      local_b2 = local_70 < local_68 || local_68 == 0;
    }
    if (!local_b2) {
      _Var5 = std::__atomic_base::operator_cast_to_unsigned_long
                        ((__atomic_base<unsigned_long> *)
                         CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
      if (local_60 <= _Var5) {
        return true;
      }
      bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
      if (bVar2) {
        peVar6 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x17f6b9);
        iVar3 = (**(code **)(*(long *)peVar6 + 0x38))();
        if (1 < iVar3) {
          peVar6 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x17f6df);
          format = local_98;
          msg_if_given_abi_cxx11_
                    ((char *)format,
                     "updating precommit_index_ failed after %zu/%zu attempts, last seen precommit_index_ %lu, target %lu"
                     ,local_70,local_68,local_78,local_60);
          (**(code **)(*(long *)peVar6 + 0x40))
                    (peVar6,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                     ,"try_update_precommit_index",0x3b6,format);
          std::__cxx11::string::~string(local_98);
        }
      }
      return false;
    }
    puVar7 = (ulong *)(in_RDI + 0x90);
    local_48 = local_60;
    local_4c = 5;
    local_40 = &local_78;
    local_38 = puVar7;
    local_20 = std::__cmpexch_failure_order
                         ((memory_order)((ulong)in_stack_fffffffffffffe10 >> 0x20));
    local_18 = uVar1;
    local_1c = 5;
    local_28 = uVar1;
    switch(0x17f092) {
    default:
      if (local_20 - memory_order_consume < 2) {
        LOCK();
        uVar4 = *puVar7;
        local_29 = local_78 == uVar4;
        if (local_29) {
          *puVar7 = uVar1;
          uVar4 = local_78;
        }
        UNLOCK();
        if (!local_29) {
          local_78 = uVar4;
        }
      }
      else if (local_20 == memory_order_seq_cst) {
        LOCK();
        uVar4 = *puVar7;
        local_29 = local_78 == uVar4;
        if (local_29) {
          *puVar7 = uVar1;
          uVar4 = local_78;
        }
        UNLOCK();
        if (!local_29) {
          local_78 = uVar4;
        }
      }
      else {
        LOCK();
        uVar4 = *puVar7;
        local_29 = local_78 == uVar4;
        if (local_29) {
          *puVar7 = uVar1;
          uVar4 = local_78;
        }
        UNLOCK();
        if (!local_29) {
          local_78 = uVar4;
        }
      }
      break;
    case 2:
      if (local_20 - memory_order_consume < 2) {
        LOCK();
        uVar4 = *puVar7;
        local_29 = local_78 == uVar4;
        if (local_29) {
          *puVar7 = uVar1;
          uVar4 = local_78;
        }
        UNLOCK();
        if (!local_29) {
          local_78 = uVar4;
        }
      }
      else if (local_20 == memory_order_seq_cst) {
        LOCK();
        uVar4 = *puVar7;
        local_29 = local_78 == uVar4;
        if (local_29) {
          *puVar7 = uVar1;
          uVar4 = local_78;
        }
        UNLOCK();
        if (!local_29) {
          local_78 = uVar4;
        }
      }
      else {
        LOCK();
        uVar4 = *puVar7;
        local_29 = local_78 == uVar4;
        if (local_29) {
          *puVar7 = uVar1;
          uVar4 = local_78;
        }
        UNLOCK();
        if (!local_29) {
          local_78 = uVar4;
        }
      }
      break;
    case 3:
      if (local_20 - memory_order_consume < 2) {
        LOCK();
        uVar4 = *puVar7;
        local_29 = local_78 == uVar4;
        if (local_29) {
          *puVar7 = uVar1;
          uVar4 = local_78;
        }
        UNLOCK();
        if (!local_29) {
          local_78 = uVar4;
        }
      }
      else if (local_20 == memory_order_seq_cst) {
        LOCK();
        uVar4 = *puVar7;
        local_29 = local_78 == uVar4;
        if (local_29) {
          *puVar7 = uVar1;
          uVar4 = local_78;
        }
        UNLOCK();
        if (!local_29) {
          local_78 = uVar4;
        }
      }
      else {
        LOCK();
        uVar4 = *puVar7;
        local_29 = local_78 == uVar4;
        if (local_29) {
          *puVar7 = uVar1;
          uVar4 = local_78;
        }
        UNLOCK();
        if (!local_29) {
          local_78 = uVar4;
        }
      }
      break;
    case 4:
      if (local_20 - memory_order_consume < 2) {
        LOCK();
        uVar4 = *puVar7;
        local_29 = local_78 == uVar4;
        if (local_29) {
          *puVar7 = uVar1;
          uVar4 = local_78;
        }
        UNLOCK();
        if (!local_29) {
          local_78 = uVar4;
        }
      }
      else if (local_20 == memory_order_seq_cst) {
        LOCK();
        uVar4 = *puVar7;
        in_stack_fffffffffffffe1f = local_78 == uVar4;
        if ((bool)in_stack_fffffffffffffe1f) {
          *puVar7 = uVar1;
          uVar4 = local_78;
        }
        UNLOCK();
        local_29 = (bool)in_stack_fffffffffffffe1f;
        if (!(bool)in_stack_fffffffffffffe1f) {
          local_78 = uVar4;
        }
      }
      else {
        LOCK();
        uVar4 = *puVar7;
        local_29 = local_78 == uVar4;
        if (local_29) {
          *puVar7 = uVar1;
          uVar4 = local_78;
        }
        UNLOCK();
        if (!local_29) {
          local_78 = uVar4;
        }
      }
    }
    if (local_29 != false) break;
    local_70 = local_70 + 1;
    local_10 = &local_78;
    local_8 = puVar7;
  }
  return true;
}

Assistant:

bool raft_server::try_update_precommit_index(ulong desired, const size_t MAX_ATTEMPTS) {
    // If `MAX_ATTEMPTS == 0`, try forever.
    size_t num_attempts = 0;
    ulong prev_precommit_index = precommit_index_;
    while ( prev_precommit_index < desired &&
            (num_attempts < MAX_ATTEMPTS || MAX_ATTEMPTS == 0) ) {
        if ( precommit_index_.compare_exchange_strong( prev_precommit_index,
                                                       desired ) ) {
            return true;
        }
        // Otherwise: retry until `precommit_index_` is equal to or greater than
        //            `desired`.
        num_attempts++;
    }
    if (precommit_index_ >= desired) {
        return true;
    }
    p_er("updating precommit_index_ failed after %zu/%zu attempts, "
         "last seen precommit_index_ %" PRIu64 ", target %" PRIu64,
         num_attempts, MAX_ATTEMPTS, prev_precommit_index, desired);
    return false;
}